

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfx2wav.cc
# Opt level: O3

PBuffer __thiscall ConvertorSFX2WAV::create_data(ConvertorSFX2WAV *this,PBuffer *data)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  PBuffer PVar6;
  undefined1 local_39;
  MutableBuffer *local_38;
  element_type *peStack_30;
  EndianessMode local_1c;
  
  local_1c = EndianessBig;
  std::__shared_ptr<MutableBuffer,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<MutableBuffer>,Buffer::EndianessMode>
            ((__shared_ptr<MutableBuffer,(__gnu_cxx::_Lock_policy)2> *)&local_38,
             (allocator<MutableBuffer> *)&local_39,&local_1c);
  while( true ) {
    bVar3 = Buffer::readable((Buffer *)*in_RDX);
    if (!bVar3) break;
    pbVar2 = *(byte **)(*in_RDX + 0x40);
    bVar1 = *pbVar2;
    *(byte **)(*in_RDX + 0x40) = pbVar2 + 1;
    iVar5 = (uint)bVar1 +
            *(int *)&data[3].super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
    iVar4 = 0xff - iVar5;
    if (*(char *)((long)&data[3].super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 4) == '\0') {
      iVar4 = iVar5;
    }
    MutableBuffer::push<short>(local_38,(short)(iVar4 << 8) - (short)iVar4,1);
  }
  (this->super_ConvertorPCM2WAV).super_Convertor._vptr_Convertor = (_func_int **)local_38;
  (this->super_ConvertorPCM2WAV).super_Convertor.buffer.
  super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_30;
  PVar6.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar6.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (PBuffer)PVar6.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

PBuffer
ConvertorSFX2WAV::create_data(PBuffer data) {
  PMutableBuffer res = std::make_shared<MutableBuffer>(Buffer::EndianessBig);

  while (data->readable()) {
    int value = data->pop<uint8_t>();
    value = value + level;
    if (invert) {
      value = 0xFF - value;
    }
    value *= 0xFF;
    res->push<int16_t>(value);
  }

  return res;
}